

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O1

void make_ddrelocs(GlobalVars *gv,LinkedSection *ddrel)

{
  LinkedSection *pLVar1;
  node *pnVar2;
  uint8_t *vp;
  uint8_t *puVar3;
  uint32_t x;
  node *pnVar4;
  node *size;
  
  pLVar1 = find_lnksec(gv,".sdata",'\0','\0','\0','\0');
  x = 0;
  if ((pLVar1 != (LinkedSection *)0x0) &&
     (pnVar2 = (pLVar1->relocs).first, x = 0, pnVar2->next != (node *)0x0)) {
    x = 0;
    do {
      if ((LinkedSection *)pnVar2[1].pred == pLVar1) {
        x = x + (*(char *)&pnVar2[3].pred == '\x01');
      }
      pnVar2 = pnVar2->next;
    } while (pnVar2->next != (node *)0x0);
  }
  size = (node *)((ulong)(x + 1) << 2);
  pnVar2 = (node *)alloc((size_t)size);
  write32be(pnVar2,x);
  if ((pLVar1 != (LinkedSection *)0x0) &&
     (pnVar4 = (pLVar1->relocs).first, pnVar4->next != (node *)0x0)) {
    vp = (uint8_t *)((long)&pnVar2->next + 4);
    do {
      puVar3 = vp;
      if (((LinkedSection *)pnVar4[1].pred == pLVar1) && (*(char *)&pnVar4[3].pred == '\x01')) {
        puVar3 = vp + 4;
        write32be(vp,*(uint32_t *)&pnVar4[2].next);
      }
      pnVar4 = pnVar4->next;
      vp = puVar3;
    } while (pnVar4->next != (node *)0x0);
  }
  ddrel->data = (uint8_t *)pnVar2;
  ddrel->filesize = (unsigned_long)size;
  ddrel->size = (unsigned_long)size;
  pnVar4 = (ddrel->sections).first;
  if (pnVar4 != (node *)0x0) {
    pnVar4[4].pred = pnVar2;
    pnVar4[5].next = size;
  }
  return;
}

Assistant:

static void make_ddrelocs(struct GlobalVars *gv,struct LinkedSection *ddrel)
{
  struct LinkedSection *sdata;
  struct Section *sec;
  struct Reloc *rel;
  uint8_t *table;
  uint32_t *p;
  unsigned long size;
  uint32_t nrelocs = 0;

  if (sdata = find_lnksec(gv,sdata_name,0,0,0,0)) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        nrelocs++;
    }
  }

  size = (nrelocs+1) * sizeof(uint32_t);
  table = alloc(size);
  p = (uint32_t *)table;
  write32be(p++,nrelocs);

  if (sdata) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        write32be(p++,(uint32_t)rel->offset);
    }
  }

  ddrel->data = table;
  ddrel->size = ddrel->filesize = size;
  if (sec = (struct Section *)ddrel->sections.first) {
    sec->data = table;
    sec->size = size;
  }
}